

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O3

string * __thiscall
xmrig::OclCache::cacheKey_abi_cxx11_
          (string *__return_storage_ptr__,OclCache *this,char *deviceKey,char *options,char *source)

{
  size_t sVar1;
  string in;
  uint8_t result [32];
  uint8_t hash [200];
  uint8_t *local_128;
  int local_120;
  uint8_t local_118 [16];
  uint8_t local_108 [32];
  allocator local_e8 [200];
  
  std::__cxx11::string::string((string *)&local_128,options,local_e8);
  std::__cxx11::string::append((char *)&local_128);
  std::__cxx11::string::append((char *)&local_128);
  keccak(local_128,local_120,(uint8_t *)local_e8,200);
  local_108[0x10] = '\0';
  local_108[0x11] = '\0';
  local_108[0x12] = '\0';
  local_108[0x13] = '\0';
  local_108[0x14] = '\0';
  local_108[0x15] = '\0';
  local_108[0x16] = '\0';
  local_108[0x17] = '\0';
  local_108[0x18] = '\0';
  local_108[0x19] = '\0';
  local_108[0x1a] = '\0';
  local_108[0x1b] = '\0';
  local_108[0x1c] = '\0';
  local_108[0x1d] = '\0';
  local_108[0x1e] = '\0';
  local_108[0x1f] = '\0';
  local_108[0] = '\0';
  local_108[1] = '\0';
  local_108[2] = '\0';
  local_108[3] = '\0';
  local_108[4] = '\0';
  local_108[5] = '\0';
  local_108[6] = '\0';
  local_108[7] = '\0';
  local_108[8] = '\0';
  local_108[9] = '\0';
  local_108[10] = '\0';
  local_108[0xb] = '\0';
  local_108[0xc] = '\0';
  local_108[0xd] = '\0';
  local_108[0xe] = '\0';
  local_108[0xf] = '\0';
  base32_encode((uint8_t *)local_e8,0xc,local_108,0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen((char *)local_108);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_108,local_108 + sVar1);
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string xmrig::OclCache::cacheKey(const char *deviceKey, const char *options, const char *source)
{
    std::string in(source);
    in += options;
    in += deviceKey;

    uint8_t hash[200];
    keccak(in.c_str(), in.size(), hash);

    uint8_t result[32] = { 0 };
    base32_encode(hash, 12, result, sizeof(result));

    return reinterpret_cast<char *>(result);
}